

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O2

void __thiscall CTcGenTarg::add_debug_line_table(CTcGenTarg *this,ulong ofs)

{
  long lVar1;
  tct3_debug_line_page *ptVar2;
  tct3_debug_line_page *ptVar3;
  uint32_t tmp;
  ulong uVar4;
  
  uVar4 = this->debug_line_cnt_ & 0x3ff;
  if (uVar4 == 0) {
    ptVar2 = (tct3_debug_line_page *)malloc(0x1408);
    ptVar2->nxt = (tct3_debug_line_page *)0x0;
    ptVar3 = (tct3_debug_line_page *)&this->debug_line_head_;
    if (this->debug_line_tail_ != (tct3_debug_line_page *)0x0) {
      ptVar3 = this->debug_line_tail_;
    }
    ptVar3->nxt = ptVar2;
    this->debug_line_tail_ = ptVar2;
  }
  else {
    ptVar2 = this->debug_line_tail_;
  }
  lVar1 = uVar4 * 5;
  ptVar2->line_ofs[lVar1] = (G_cs->super_CTcDataStream).stream_id_;
  *(int *)(ptVar2->line_ofs + lVar1 + 1) = (int)ofs;
  this->debug_line_cnt_ = this->debug_line_cnt_ + 1;
  return;
}

Assistant:

void CTcGenTarg::add_debug_line_table(ulong ofs)
{
    size_t idx;
    uchar *p;

    /* calculate the index of the next free entry on its page */
    idx = (size_t)(debug_line_cnt_ % TCT3_DEBUG_LINE_PAGE_SIZE);

    /* 
     *   if we've completely filled the last page, allocate a new one - we
     *   know we've exhausted the page if we're at the start of a new page
     *   (i.e., the index is zero) 
     */
    if (idx == 0)
    {
        tct3_debug_line_page *pg;

        /* allocate the new page */
        pg = (tct3_debug_line_page *)t3malloc(sizeof(*pg));

        /* link it in at the end of the list */
        pg->nxt = 0;
        if (debug_line_tail_ == 0)
            debug_line_head_ = pg;
        else
            debug_line_tail_->nxt = pg;
        debug_line_tail_ = pg;
    }

    /* get a pointer to the entry */
    p = debug_line_tail_->line_ofs + (idx * TCT3_DEBUG_LINE_REC_SIZE);

    /* 
     *   set this entry - one byte for the code stream ID, then a UINT4 with
     *   the offset in the stream 
     */
    *p = G_cs->get_stream_id();
    oswp4(p + 1, ofs);

    /* count it */
    ++debug_line_cnt_;
}